

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImgDisplay * __thiscall
cimg_library::CImgDisplay::resize(CImgDisplay *this,int nwidth,int nheight,bool force_redraw)

{
  Display *pDVar1;
  int iVar2;
  int iVar3;
  X11_static *pXVar4;
  CImgDisplay *pCVar5;
  uint uVar6;
  uint ndimx;
  bool bVar7;
  bool bVar8;
  XWindowAttributes attr;
  
  if (nheight != 0 && nwidth != 0) {
    bVar7 = this->_width == 0;
    bVar8 = this->_height == 0;
    if (-1 < (nheight | nwidth) || !bVar8 && !bVar7) {
      if (bVar8 || bVar7) {
        this = assign(this,nwidth,nheight,(char *)0x0,3,false,false);
      }
      else {
        pXVar4 = cimg::X11_attr();
        pDVar1 = pXVar4->display;
        if (nwidth < 1) {
          nwidth = (int)-(nwidth * this->_width) / 100;
        }
        if (nheight < 1) {
          nheight = (int)-(nheight * this->_height) / 100;
        }
        ndimx = nwidth + (uint)(nwidth == 0);
        uVar6 = nheight + (uint)(nheight == 0);
        if ((((this->_width != ndimx) || (this->_height != uVar6)) || (this->_window_width != ndimx)
            ) || (this->_window_height != uVar6)) {
          show(this);
          cimg::mutex(0xf,1);
          if ((this->_window_width != ndimx) || (this->_window_height != uVar6)) {
            iVar2 = 10;
            while (bVar7 = iVar2 != 0, iVar2 = iVar2 + -1, bVar7) {
              XResizeWindow(pDVar1,this->_window,ndimx,uVar6);
              XGetWindowAttributes(pDVar1,this->_window,&attr);
              if ((attr.width == ndimx) && (attr.height == uVar6)) break;
              cimg::wait((cimg *)0x5,this);
            }
          }
          if ((this->_width != ndimx) || (this->_height != uVar6)) {
            pXVar4 = cimg::X11_attr();
            if (pXVar4->nb_bits == 0x10) {
              _resize<unsigned_short>(this,0,ndimx,uVar6,force_redraw);
            }
            else if (pXVar4->nb_bits == 8) {
              _resize<unsigned_char>(this,'\0',ndimx,uVar6,force_redraw);
            }
            else {
              _resize<unsigned_int>(this,0,ndimx,uVar6,force_redraw);
            }
          }
          this->_width = ndimx;
          this->_window_width = ndimx;
          this->_height = uVar6;
          this->_window_height = uVar6;
          cimg::mutex(0xf,0);
        }
        this->_is_resized = false;
        if (this->_is_fullscreen == true) {
          iVar2 = screen_width();
          uVar6 = this->_width;
          iVar3 = screen_height();
          move(this,iVar2 - uVar6 >> 1,iVar3 - this->_height >> 1);
        }
        if (force_redraw) {
          this = paint(this,true);
        }
      }
      return this;
    }
  }
  pCVar5 = assign(this);
  return pCVar5;
}

Assistant:

CImgDisplay& resize(const int nwidth, const int nheight, const bool force_redraw=true) {
      if (!nwidth || !nheight || (is_empty() && (nwidth<0 || nheight<0))) return assign();
      if (is_empty()) return assign(nwidth,nheight);
      Display *const dpy = cimg::X11_attr().display;
      const unsigned int
        tmpdimx = (nwidth>0)?nwidth:(-nwidth*width()/100),
        tmpdimy = (nheight>0)?nheight:(-nheight*height()/100),
        dimx = tmpdimx?tmpdimx:1,
        dimy = tmpdimy?tmpdimy:1;
      if (_width!=dimx || _height!=dimy || _window_width!=dimx || _window_height!=dimy) {
        show();
        cimg_lock_display();
        if (_window_width!=dimx || _window_height!=dimy) {
          XWindowAttributes attr;
          for (unsigned int i = 0; i<10; ++i) {
            XResizeWindow(dpy,_window,dimx,dimy);
            XGetWindowAttributes(dpy,_window,&attr);
            if (attr.width==(int)dimx && attr.height==(int)dimy) break;
            cimg::wait(5,&_timer);
          }
        }
        if (_width!=dimx || _height!=dimy) switch (cimg::X11_attr().nb_bits) {
          case 8 :  { unsigned char pixel_type = 0; _resize(pixel_type,dimx,dimy,force_redraw); } break;
          case 16 : { unsigned short pixel_type = 0; _resize(pixel_type,dimx,dimy,force_redraw); } break;
          default : { unsigned int pixel_type = 0; _resize(pixel_type,dimx,dimy,force_redraw); }
          }
        _window_width = _width = dimx; _window_height = _height = dimy;
        cimg_unlock_display();
      }
      _is_resized = false;
      if (_is_fullscreen) move((screen_width() - _width)/2,(screen_height() - _height)/2);
      if (force_redraw) return paint();
      return *this;
    }